

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O0

bool __thiscall
CoinStatsIndex::CustomInit(CoinStatsIndex *this,optional<interfaces::BlockRef> *block)

{
  long lVar1;
  bool bVar2;
  CDBWrapper *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000030;
  char (*in_stack_00000040) [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  uint256 out;
  DBVal entry;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  base_blob<256U> *in_stack_fffffffffffffe90;
  MuHash3072 *in_stack_fffffffffffffe98;
  DBVal *in_stack_fffffffffffffea0;
  BlockRef *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  CDBWrapper *in_stack_fffffffffffffeb8;
  MuHash3072 *in_stack_fffffffffffffed0;
  uchar *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  int in_stack_fffffffffffffefc;
  ConstevalFormatString<2U> in_stack_ffffffffffffff38;
  string_view in_stack_ffffffffffffff40;
  string_view in_stack_ffffffffffffff50;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator->
            ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  bVar2 = CDBWrapper::Read<unsigned_char,MuHash3072>
                    (in_RSI,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  if (!bVar2) {
    std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator->
              ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    bVar2 = CDBWrapper::Exists<unsigned_char>
                      (in_stack_fffffffffffffeb8,
                       (uchar *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea8,
                 (char *)in_stack_fffffffffffffea0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea8,
                 (char *)in_stack_fffffffffffffea0);
      BaseIndex::GetName_abi_cxx11_
                ((BaseIndex *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      LogPrintFormatInternal<char[11],std::__cxx11::string>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff40,in_stack_fffffffffffffefc,
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),in_stack_00000030,
                 in_stack_ffffffffffffff38,in_stack_00000040,in_stack_00000048);
      bVar2 = false;
      goto LAB_00f93c94;
    }
  }
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<interfaces::BlockRef> *)
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  if (bVar2) {
    anon_unknown.dwarf_193474c::DBVal::DBVal
              ((DBVal *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator*
              ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
               in_stack_fffffffffffffe98);
    std::optional<interfaces::BlockRef>::operator*
              ((optional<interfaces::BlockRef> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    bVar2 = LookUpOne((CDBWrapper *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                      in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    if (!bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea8,
                 (char *)in_stack_fffffffffffffea0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea8,
                 (char *)in_stack_fffffffffffffea0);
      BaseIndex::GetName_abi_cxx11_
                ((BaseIndex *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      LogPrintFormatInternal<char[11],std::__cxx11::string>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff40,in_stack_fffffffffffffefc,
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),in_stack_00000030,
                 in_stack_ffffffffffffff38,in_stack_00000040,in_stack_00000048);
      bVar2 = false;
      goto LAB_00f93c94;
    }
    uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    MuHash3072::Finalize(in_stack_fffffffffffffe98,(uint256 *)in_stack_fffffffffffffe90);
    bVar2 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea8,
                 (char *)in_stack_fffffffffffffea0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea8,
                 (char *)in_stack_fffffffffffffea0);
      BaseIndex::GetName_abi_cxx11_
                ((BaseIndex *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      LogPrintFormatInternal<char[11],std::__cxx11::string>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff40,in_stack_fffffffffffffefc,
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),in_stack_00000030,
                 in_stack_ffffffffffffff38,in_stack_00000040,in_stack_00000048);
      bVar2 = false;
      goto LAB_00f93c94;
    }
    *(undefined8 *)(in_RDI + 0x3b8) = local_68;
    *(undefined8 *)(in_RDI + 0x3c0) = local_60;
    *(undefined8 *)(in_RDI + 0x3c8) = local_58;
    *(undefined8 *)(in_RDI + 0x3d0) = local_50;
    *(undefined8 *)(in_RDI + 0x3d8) = local_48;
    *(undefined8 *)(in_RDI + 0x3e0) = local_40;
    *(undefined8 *)(in_RDI + 1000) = local_38;
    *(undefined8 *)(in_RDI + 0x3f0) = local_30;
    *(undefined8 *)(in_RDI + 0x3f8) = local_28;
    *(undefined8 *)(in_RDI + 0x400) = local_20;
    *(undefined8 *)(in_RDI + 0x408) = local_18;
    *(undefined8 *)(in_RDI + 0x410) = local_10;
  }
  bVar2 = true;
LAB_00f93c94:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CoinStatsIndex::CustomInit(const std::optional<interfaces::BlockRef>& block)
{
    if (!m_db->Read(DB_MUHASH, m_muhash)) {
        // Check that the cause of the read failure is that the key does not
        // exist. Any other errors indicate database corruption or a disk
        // failure, and starting the index would cause further corruption.
        if (m_db->Exists(DB_MUHASH)) {
            LogError("%s: Cannot read current %s state; index may be corrupted\n",
                         __func__, GetName());
            return false;
        }
    }

    if (block) {
        DBVal entry;
        if (!LookUpOne(*m_db, *block, entry)) {
            LogError("%s: Cannot read current %s state; index may be corrupted\n",
                         __func__, GetName());
            return false;
        }

        uint256 out;
        m_muhash.Finalize(out);
        if (entry.muhash != out) {
            LogError("%s: Cannot read current %s state; index may be corrupted\n",
                         __func__, GetName());
            return false;
        }

        m_transaction_output_count = entry.transaction_output_count;
        m_bogo_size = entry.bogo_size;
        m_total_amount = entry.total_amount;
        m_total_subsidy = entry.total_subsidy;
        m_total_unspendable_amount = entry.total_unspendable_amount;
        m_total_prevout_spent_amount = entry.total_prevout_spent_amount;
        m_total_new_outputs_ex_coinbase_amount = entry.total_new_outputs_ex_coinbase_amount;
        m_total_coinbase_amount = entry.total_coinbase_amount;
        m_total_unspendables_genesis_block = entry.total_unspendables_genesis_block;
        m_total_unspendables_bip30 = entry.total_unspendables_bip30;
        m_total_unspendables_scripts = entry.total_unspendables_scripts;
        m_total_unspendables_unclaimed_rewards = entry.total_unspendables_unclaimed_rewards;
    }

    return true;
}